

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall calculator::SyntaxError::SyntaxError(SyntaxError *this,string *error)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  *(undefined ***)this = &PTR__SyntaxError_00116720;
  (this->error_msg)._M_dataplus._M_p = (pointer)&(this->error_msg).field_2;
  (this->error_msg)._M_string_length = 0;
  (this->error_msg).field_2._M_local_buf[0] = '\0';
  std::operator+(&bStack_38,"Error: ",error);
  std::__cxx11::string::operator=((string *)&this->error_msg,(string *)&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

SyntaxError(const std::string& error = "") {
        error_msg = "Error: " + error;
    }